

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

RandMode __thiscall slang::ast::Symbol::getRandMode(Symbol *this)

{
  ClassPropertySymbol *pCVar1;
  FieldSymbol *pFVar2;
  int *in_RDI;
  RandMode local_4;
  
  if (*in_RDI == 0x3e) {
    pFVar2 = as<slang::ast::FieldSymbol>((Symbol *)0x767d4b);
    local_4 = pFVar2->randMode;
  }
  else if (*in_RDI == 0x3f) {
    pCVar1 = as<slang::ast::ClassPropertySymbol>((Symbol *)0x767d35);
    local_4 = pCVar1->randMode;
  }
  else {
    local_4 = None;
  }
  return local_4;
}

Assistant:

RandMode Symbol::getRandMode() const {
    switch (kind) {
        case SymbolKind::ClassProperty:
            return as<ClassPropertySymbol>().randMode;
        case SymbolKind::Field:
            return as<FieldSymbol>().randMode;
        default:
            return RandMode::None;
    }
}